

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O2

void gl_gears_term(gears_t *gears)

{
  char *__s;
  
  if (gears != (gears_t *)0x0) {
    if (gears->gear[2] != (gear *)0x0) {
      delete_gear(gears,2);
    }
    if (gears->gear[1] != (gear *)0x0) {
      delete_gear(gears,1);
    }
    if (gears->gear[0] != (gear *)0x0) {
      delete_gear(gears,0);
    }
    __s = (char *)glGetString(0x1f02);
    puts(__s);
    free(gears);
    return;
  }
  return;
}

Assistant:

static void gl_gears_term(gears_t *gears)
{
  if (!gears) {
    return;
  }

  if (gears->gear[GEAR2]) {
    delete_gear(gears, GEAR2);
  }
  if (gears->gear[GEAR1]) {
    delete_gear(gears, GEAR1);
  }
  if (gears->gear[GEAR0]) {
    delete_gear(gears, GEAR0);
  }

  printf("%s\n", glGetString(GL_VERSION));

  free(gears);
}